

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjFixup::CVmObjFixup(CVmObjFixup *this,ulong entry_cnt)

{
  void *pvVar1;
  long in_RSI;
  long *in_RDI;
  size_t cur_cnt;
  uint i;
  long local_20;
  uint local_14;
  
  in_RDI[2] = in_RSI;
  in_RDI[3] = 0;
  if (in_RDI[2] == 0) {
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  else {
    in_RDI[1] = in_RSI + 0x7ffU >> 0xb;
    pvVar1 = malloc(in_RDI[1] << 3);
    *in_RDI = (long)pvVar1;
    for (local_14 = 0; (ulong)local_14 < (ulong)in_RDI[1]; local_14 = local_14 + 1) {
      local_20 = 0x800;
      if ((ulong)(local_14 + 1) == in_RDI[1]) {
        local_20 = (in_RSI - 1U & 0x7ff) + 1;
      }
      pvVar1 = malloc(local_20 << 3);
      *(void **)(*in_RDI + (ulong)local_14 * 8) = pvVar1;
    }
  }
  return;
}

Assistant:

CVmObjFixup::CVmObjFixup(ulong entry_cnt)
{
    uint i;

    /* remember the number of entries */
    cnt_ = entry_cnt;
    
    /* no entries are used yet */
    used_ = 0;
    
    /* if we have no entries, there's nothing to do */
    if (cnt_ == 0)
    {
        arr_ = 0;
        pages_ = 0;
        return;
    }

    /* calculate the number of subarrays we need */
    pages_ = (entry_cnt + VMOBJFIXUP_SUB_SIZE - 1) / VMOBJFIXUP_SUB_SIZE;
    
    /* allocate the necessary number of subarrays */
    arr_ = (obj_fixup_entry **)t3malloc(pages_ * sizeof(arr_[0]));
    
    /* allocate the subarrays */
    for (i = 0 ; i < pages_ ; ++i)
    {
        size_t cur_cnt;
        
        /* 
         *   allocate a full page, except for the last page, which might be
         *   only partially used 
         */
        cur_cnt = VMOBJFIXUP_SUB_SIZE;
        if (i + 1 == pages_)
            cur_cnt = ((entry_cnt - 1) % VMOBJFIXUP_SUB_SIZE) + 1;
        
        /* allocate it */
        arr_[i] = (obj_fixup_entry *)t3malloc(cur_cnt * sizeof(arr_[i][i]));
    }
}